

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O2

uint cpuid_from_mask(uint64_t mask,uint *thread_index)

{
  uint uVar1;
  uint i;
  uint uVar2;
  
  if (cpuid_from_mask(unsigned_long,unsigned_int_const&)::init == '\0') {
    uVar1 = 0;
    for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
      if ((mask & 1) != 0) {
        cpuid_from_mask::lookup[uVar1] = uVar2;
        uVar1 = uVar1 + 1;
      }
      mask = mask >> 1;
    }
    cpuid_from_mask(unsigned_long,unsigned_int_const&)::init = '\x01';
  }
  return cpuid_from_mask::lookup[*thread_index];
}

Assistant:

unsigned
cpuid_from_mask(uint64_t mask, const unsigned &thread_index)
{
    static unsigned lookup[64];
    static bool init = false;
    if (init)
        return lookup[thread_index];
    unsigned count_found = 0;
    for (unsigned i=0; i<64; i++)
    {
        if (1ULL & mask)
        {
            lookup[count_found] = i;
            count_found++;
        }
        mask >>= 1;
    }
    init = true;
    return lookup[thread_index];
}